

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.c
# Opt level: O1

sexp sexp_bignum_fxmul(sexp ctx,sexp d,sexp a,sexp_uint_t b,int offset)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  long lVar4;
  sexp psVar5;
  ulong uVar6;
  sexp psVar7;
  sexp tmp;
  sexp_gc_var_t __sexp_gc_preserver1;
  sexp local_50;
  sexp_gc_var_t local_48;
  
  psVar7 = (a->value).type.cpl;
  local_48.var = &local_50;
  local_50 = (sexp)0x43e;
  local_48.next = (ctx->value).context.saves;
  (ctx->value).context.saves = &local_48;
  lVar4 = (long)offset;
  if ((d == (sexp)0x0) || ((d->value).type.cpl < (sexp)((long)&psVar7->tag + lVar4))) {
    d = sexp_make_bignum(ctx,(long)&psVar7->tag + lVar4);
  }
  if (psVar7 == (sexp)0x0) {
    uVar6 = 0;
  }
  else {
    psVar5 = (sexp)0x0;
    uVar6 = 0;
    do {
      auVar3._8_8_ = 0;
      auVar3._0_8_ = uVar6;
      auVar1._8_8_ = 0;
      auVar1._0_8_ = b;
      auVar2._8_8_ = 0;
      auVar2._0_8_ = *(ulong *)((long)&a->value + (long)psVar5 * 8 + 0x10);
      auVar3 = auVar1 * auVar2 + auVar3;
      uVar6 = auVar3._8_8_;
      *(long *)((long)&d->value + (long)psVar5 * 8 + lVar4 * 8 + 0x10) = auVar3._0_8_;
      psVar5 = (sexp)((long)&psVar5->tag + 1);
    } while (psVar7 != psVar5);
  }
  if (uVar6 != 0) {
    psVar7 = (sexp)((long)&psVar7->tag + lVar4);
    if ((d->value).type.cpl <= psVar7) {
      local_50 = d;
      d = sexp_copy_bignum(ctx,(sexp)0x0,d,(sexp_uint_t)((long)&psVar7->tag + 1));
    }
    *(ulong *)((long)&d->value + (long)psVar7 * 8 + 0x10) = uVar6;
  }
  (ctx->value).context.saves = local_48.next;
  return d;
}

Assistant:

sexp sexp_bignum_fxmul (sexp ctx, sexp d, sexp a, sexp_uint_t b, int offset) {
  sexp_uint_t len=sexp_bignum_length(a), *data, *adata=sexp_bignum_data(a),
    carry=0, i;
  sexp_luint_t n;
  sexp_gc_var1(tmp);
  sexp_gc_preserve1(ctx, tmp);
  if ((! d) || (sexp_bignum_length(d) < len+offset))
    d = sexp_make_bignum(ctx, len+offset);
  tmp = d;
  data = sexp_bignum_data(d);
  for (i=0; i<len; i++) {
    n = luint_add(luint_mul_uint(luint_from_uint(adata[i]), b), luint_from_uint(carry));
    data[i+offset] = luint_to_uint(n);
    carry = luint_to_uint(luint_shr(n, (sizeof(sexp_uint_t)*8)));
  }
  if (carry) {
    if (sexp_bignum_length(d) <= len+offset)
      d = sexp_copy_bignum(ctx, NULL, d, len+offset+1);
    sexp_bignum_data(d)[len+offset] = carry;
  }
  sexp_gc_release1(ctx);
  return d;
}